

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O3

int Abc_ObjMvVarNum(Abc_Obj_t *pObj)

{
  Vec_Ptr_t *pVVar1;
  void *pvVar2;
  int *piVar3;
  int iVar4;
  
  pVVar1 = pObj->pNtk->vAttrs;
  if (0xc < pVVar1->nSize) {
    iVar4 = 2;
    if (pVVar1->pArray[0xc] != (void *)0x0) {
      pvVar2 = Abc_ObjMvVar(pObj);
      if (pvVar2 != (void *)0x0) {
        piVar3 = (int *)Abc_ObjMvVar(pObj);
        iVar4 = *piVar3;
      }
    }
    return iVar4;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

static inline int         Abc_ObjMvVarNum( Abc_Obj_t * pObj )           { return (Abc_NtkMvVar(pObj->pNtk) && Abc_ObjMvVar(pObj))? *((int*)Abc_ObjMvVar(pObj)) : 2; }